

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O1

ssize_t __thiscall QMakeProject::read(QMakeProject *this,int __fd,void *__buf,size_t __nbytes)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  char cVar3;
  VisitReturn VVar4;
  QArrayData *pQVar5;
  undefined4 in_register_00000034;
  QString *pQVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QFileInfo local_c0 [8];
  QArrayData *local_b8;
  char16_t *pcStack_b0;
  qsizetype local_a8;
  QArrayData *local_98 [3];
  QDir local_80 [8];
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  pQVar6 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::operator=(&this->m_projectFile,pQVar6);
  QString::operator=(&(this->super_QMakeEvaluator).m_outputDir,(QString *)&Option::output_dir);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(long *)(pQVar6 + 0x10) == 1) {
    QVar7.m_data = *(storage_type_conflict **)(pQVar6 + 8);
    QVar7.m_size = 1;
    QVar9.m_data = "-";
    QVar9.m_size = 1;
    cVar3 = QtPrivate::equalStrings(QVar7,QVar9);
  }
  else {
    cVar3 = '\0';
  }
  if (cVar3 == '\0') {
    qmake_getpwd();
    QDir::QDir(local_80,(QString *)local_98);
    QDir::absoluteFilePath((QString *)&local_58);
    QDir::cleanPath((QString *)&local_78);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    QDir::~QDir(local_80);
    if (local_98[0] != (QArrayData *)0x0) {
      LOCK();
      (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98[0],2,0x10);
      }
    }
  }
  else {
    QVar8.m_data = (storage_type *)0x7;
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromLatin1(QVar8);
    local_78.d.d = (Data *)local_58;
    local_78.d.ptr = pcStack_50;
    local_78.d.size = (qsizetype)local_48;
  }
  QFileInfo::QFileInfo(local_c0,(QString *)&local_78);
  QFileInfo::path();
  pQVar5 = &((this->m_projectDir).d.d)->super_QArrayData;
  pcVar1 = (this->m_projectDir).d.ptr;
  (this->m_projectDir).d.d = (Data *)local_b8;
  (this->m_projectDir).d.ptr = pcStack_b0;
  qVar2 = (this->m_projectDir).d.size;
  (this->m_projectDir).d.size = local_a8;
  local_b8 = pQVar5;
  pcStack_b0 = pcVar1;
  local_a8 = qVar2;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  QFileInfo::~QFileInfo(local_c0);
  VVar4 = QMakeEvaluator::evaluateFile
                    (&this->super_QMakeEvaluator,&local_78,EvalProjectFile,
                     (QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>)SUB84(__buf,0));
  if (VVar4 == ReturnError) {
    qmakeClearCaches();
    exit(3);
  }
  pQVar5 = &(local_78.d.d)->super_QArrayData;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      pQVar5 = (QArrayData *)QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)pQVar5 >> 8),VVar4 != ReturnFalse);
}

Assistant:

bool QMakeProject::read(const QString &project, LoadFlags what)
{
    m_projectFile = project;
    setOutputDir(Option::output_dir);
    QString absproj = (project == QLatin1String("-"))
            ? QLatin1String("(stdin)")
            : QDir::cleanPath(QDir(qmake_getpwd()).absoluteFilePath(project));
    m_projectDir = QFileInfo(absproj).path();
    return boolRet(evaluateFile(absproj, QMakeHandler::EvalProjectFile, what));
}